

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::getObject(QPDF *this,QPDFObjGen og)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> _Var2;
  size_type sVar3;
  key_type in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long lVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar6;
  QPDFObjectHandle QVar7;
  QPDFObjGen in_stack_ffffffffffffffb8;
  _Head_base<0UL,_QPDF::Members_*,_false> a_Stack_40 [2];
  int local_30 [2];
  
  _Var2._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
       ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               *)(*(long *)og + 0x1a8),(key_type *)&stack0xffffffffffffffb0);
  lVar5 = *(long *)og;
  if (_Var2._M_node == (_Base_ptr)(lVar5 + 0x1b0)) {
    if (*(char *)(lVar5 + 0x2d5) == '\x01') {
      sVar3 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                       *)(lVar5 + 0x138),(key_type *)&stack0xffffffffffffffb0);
      if (sVar3 == 0) {
        QPDFObject::create<QPDF_Null>();
        _Var1._M_head_impl = a_Stack_40[0]._M_head_impl;
        a_Stack_40[0]._M_head_impl = (Members *)0x0;
        (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
             (Members *)in_stack_ffffffffffffffb8;
        this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var1._M_head_impl;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_40);
        _Var4._M_pi = extraout_RDX_00;
        goto LAB_001e0c8e;
      }
      lVar5 = *(long *)og;
    }
    QPDFObject::create<QPDF_Unresolved>((QPDF *)in_RDX,in_stack_ffffffffffffffb8);
    local_30[1] = 0xffffffff;
    local_30[0] = -1;
    pVar6 = std::
            map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
            ::try_emplace<std::shared_ptr<QPDFObject>,int,int>
                      ((map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                        *)(lVar5 + 0x1a8),(key_type *)&stack0xffffffffffffffb0,
                       (shared_ptr<QPDFObject> *)&stack0xffffffffffffffb8,local_30 + 1,local_30);
    _Var2 = pVar6.first._M_node;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_40);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&_Var2._M_node[1]._M_parent);
  _Var4._M_pi = extraout_RDX;
LAB_001e0c8e:
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getObject(QPDFObjGen og)
{
    if (auto it = m->obj_cache.find(og); it != m->obj_cache.end()) {
        return {it->second.object};
    } else if (m->parsed && !m->xref_table.count(og)) {
        return QPDFObject::create<QPDF_Null>();
    } else {
        auto result =
            m->obj_cache.try_emplace(og, QPDFObject::create<QPDF_Unresolved>(this, og), -1, -1);
        return {result.first->second.object};
    }
}